

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::_::HeapDisposer<capnp::EzRpcClient::Impl::ClientContext>::disposeImpl
          (HeapDisposer<capnp::EzRpcClient::Impl::ClientContext> *this,void *pointer)

{
  void *pointer_local;
  HeapDisposer<capnp::EzRpcClient::Impl::ClientContext> *this_local;
  
  if (pointer != (void *)0x0) {
    capnp::EzRpcClient::Impl::ClientContext::~ClientContext((ClientContext *)pointer);
    operator_delete(pointer,0x1a0);
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }